

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fullsearch.cpp
# Opt level: O2

int __thiscall FullSearch::search(FullSearch *this,Board *board)

{
  Position pos;
  bool bVar1;
  byte bVar2;
  int iVar3;
  byte bVar4;
  vector<Position,_std::allocator<Position>_> possibleChoose;
  Board tmpBoard;
  
  if (board->gameEnd == true) {
    Board::countBoard(board);
    if (tmpBoard.direction[0].col == tmpBoard.direction[0].row) {
      return 0;
    }
    if (board->nowPlayer == 0) {
      bVar1 = tmpBoard.direction[0].row < tmpBoard.direction[0].col;
    }
    else {
      if (board->nowPlayer != 1) goto LAB_00104ddc;
      bVar1 = tmpBoard.direction[0].col < tmpBoard.direction[0].row;
    }
    iVar3 = (uint)bVar1 * 2 + -1;
  }
  else {
LAB_00104ddc:
    Board::findPossibleChoose(&possibleChoose,board);
    bVar4 = 0;
    for (; possibleChoose.super__Vector_base<Position,_std::allocator<Position>_>._M_impl.
           super__Vector_impl_data._M_start !=
           possibleChoose.super__Vector_base<Position,_std::allocator<Position>_>._M_impl.
           super__Vector_impl_data._M_finish;
        possibleChoose.super__Vector_base<Position,_std::allocator<Position>_>._M_impl.
        super__Vector_impl_data._M_start =
             possibleChoose.super__Vector_base<Position,_std::allocator<Position>_>._M_impl.
             super__Vector_impl_data._M_start + 1) {
      pos = *possibleChoose.super__Vector_base<Position,_std::allocator<Position>_>._M_impl.
             super__Vector_impl_data._M_start;
      Board::Board(&tmpBoard,board);
      Board::doChoose(&tmpBoard,pos);
      iVar3 = search(this,&tmpBoard);
      bVar2 = bVar4;
      if (tmpBoard.nowPlayer == board->nowPlayer) {
        bVar2 = 1;
        if ((iVar3 != 0) && (bVar2 = bVar4, iVar3 == 1)) break;
      }
      else if (iVar3 == 0) {
        bVar2 = 1;
      }
      else if ((iVar3 != 1) && (iVar3 == -1)) break;
      bVar4 = bVar2;
    }
    iVar3 = 1;
    if (possibleChoose.super__Vector_base<Position,_std::allocator<Position>_>._M_impl.
        super__Vector_impl_data._M_start ==
        possibleChoose.super__Vector_base<Position,_std::allocator<Position>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      iVar3 = -(uint)(~bVar4 & 1);
    }
    std::_Vector_base<Position,_std::allocator<Position>_>::~_Vector_base
              (&possibleChoose.super__Vector_base<Position,_std::allocator<Position>_>);
  }
  return iVar3;
}

Assistant:

int FullSearch::search(Board &board) {
    if (board.gameEnd) {
        int whiteNum,blackNum;
        tie(ignore, whiteNum, blackNum) = board.countBoard();
        if (whiteNum == blackNum) {
            return TIE;
        }
        if (board.nowPlayer == Board::BLACK) {
            return blackNum > whiteNum ? WIN : LOST;
        }
        if (board.nowPlayer == Board::WHITE) {
            return blackNum < whiteNum ? WIN : LOST;
        }
    }
    bool isAbleToTie = false;
    bool isAbleToWin = false;

    vector<Position> possibleChoose = board.findPossibleChoose();
    for (Position choose : possibleChoose) {
        Board tmpBoard = board;
        tmpBoard.doChoose(choose);
        int value = search(tmpBoard);

        //这里胜负正好相反，下一手赢了，说明当前手输了。
        if (tmpBoard.nowPlayer != board.nowPlayer) {
            switch (value) {
                case WIN:
                    value = LOST;
                    break;
                case LOST:
                    value = WIN;
                    break;
                case TIE:
                    value = TIE;
                    break;
            }
        }
        // if(board.nowPlayer == Board::WHITE){
        //     printf("%d\n", value);
        // }

        if (value == WIN) {
            isAbleToWin = true;
            //已经找到赢的路了，剪枝
            break;
        } else if (value == TIE) {
            isAbleToTie = true;
        }
    }
    if (isAbleToWin) {
        return WIN;
    } else if (isAbleToTie) {
        return TIE;
    } else {
        return LOST;
    }
}